

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O3

bool tcu::isLinearCompareResultValid
               (ConstPixelBufferAccess *level,Sampler *sampler,TexComparePrecision *prec,Vec2 *coord
               ,int coordZ,float cmpReference,float result)

{
  int size;
  int size_00;
  undefined1 auVar1 [16];
  Sampler *sampler_00;
  bool isFixedPointDepth;
  bool bVar2;
  int i;
  int j;
  int j_00;
  float fVar3;
  float fVar4;
  float fVar5;
  uint c;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  Vec4 depths;
  Vec2 vBounds;
  Vec2 uBounds;
  Vec4 local_d8;
  float local_c8;
  float fStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  float local_b8;
  float fStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  float local_a8;
  ulong local_90;
  Sampler *local_88;
  TexComparePrecision *local_80;
  Vec2 local_78;
  Vec2 local_70;
  TexVerifierUtil local_68 [8];
  float local_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  isFixedPointDepth = isFixedPointDepthTextureFormat(&level->m_format);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_60,sampler->normalizedCoords,(level->m_size).m_data[0],
             coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  local_88 = sampler;
  local_80 = prec;
  TexVerifierUtil::computeNonNormalizedCoordBounds
            (local_68,sampler->normalizedCoords,(level->m_size).m_data[1],coord->m_data[1],
             (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  local_c8 = floorf(local_60 + -0.5);
  fVar4 = floorf(fStack_5c + -0.5);
  local_b8 = local_68._0_4_ + -0.5;
  fStack_b4 = local_68._4_4_ + -0.5;
  uStack_b0 = 0;
  uStack_ac = 0;
  local_a8 = floorf(local_b8);
  fVar5 = floorf(fStack_b4);
  sampler_00 = local_88;
  c = (uint)local_a8;
  if ((int)c <= (int)fVar5) {
    fVar3 = (float)(int)local_c8;
    size = (level->m_size).m_data[0];
    size_00 = (level->m_size).m_data[1];
    do {
      local_90 = (ulong)c;
      local_58 = (float)(int)c;
      c = c + 1;
      fVar6 = fVar3;
      fStack_54 = local_58;
      fStack_50 = local_58;
      fStack_4c = local_58;
      while ((int)fVar6 <= (int)fVar4) {
        i = TexVerifierUtil::wrap(sampler_00->wrapS,(int)fVar6,size);
        local_a8 = (float)((int)fVar6 + 1);
        local_b8 = (float)TexVerifierUtil::wrap(sampler_00->wrapS,(int)local_a8,size);
        j = TexVerifierUtil::wrap(sampler_00->wrapT,(int)local_90,size_00);
        j_00 = TexVerifierUtil::wrap(sampler_00->wrapT,c,size_00);
        fVar6 = (float)(int)fVar6;
        fVar9 = (local_60 + -0.5) - fVar6;
        fVar10 = (fStack_5c + -0.5) - fVar6;
        auVar8._4_4_ = fVar10;
        auVar8._0_4_ = fVar9;
        auVar8._8_4_ = 0.0 - fVar6;
        auVar8._12_4_ = 0.0 - fVar6;
        auVar8 = minps(_DAT_00ad7f10,auVar8);
        local_c8 = (float)(-(uint)(0.0 <= fVar9) & auVar8._0_4_);
        fStack_c4 = (float)(-(uint)(0.0 <= fVar10) & auVar8._4_4_);
        uStack_c0 = -(uint)(0.0 <= 0.0 - fVar6) & auVar8._8_4_;
        uStack_bc = -(uint)(0.0 <= 0.0 - fVar6) & auVar8._12_4_;
        fVar6 = (local_68._0_4_ + -0.5) - local_58;
        fVar9 = (local_68._4_4_ + -0.5) - fStack_54;
        auVar1._4_4_ = fVar9;
        auVar1._0_4_ = fVar6;
        auVar1._8_4_ = 0.0 - fStack_50;
        auVar1._12_4_ = 0.0 - fStack_4c;
        auVar8 = minps(_DAT_00ad7f10,auVar1);
        local_48 = (float)(-(uint)(0.0 <= fVar6) & auVar8._0_4_);
        fStack_44 = (float)(-(uint)(0.0 <= fVar9) & auVar8._4_4_);
        uStack_40 = -(uint)(0.0 <= 0.0 - fStack_50) & auVar8._8_4_;
        uStack_3c = -(uint)(0.0 <= 0.0 - fStack_4c) & auVar8._12_4_;
        fVar9 = lookupDepth(level,sampler_00,i,j,coordZ);
        fVar6 = local_b8;
        fVar10 = lookupDepth(level,sampler_00,(int)local_b8,j,coordZ);
        fVar7 = lookupDepth(level,sampler_00,i,j_00,coordZ);
        local_d8.m_data[3] = lookupDepth(level,sampler_00,(int)fVar6,j_00,coordZ);
        local_70.m_data[1] = fStack_c4;
        local_70.m_data[0] = local_c8;
        local_78.m_data[1] = fStack_44;
        local_78.m_data[0] = local_48;
        local_d8.m_data[0] = fVar9;
        local_d8.m_data[1] = fVar10;
        local_d8.m_data[2] = fVar7;
        bVar2 = isBilinearCompareValid
                          (sampler_00->compare,local_80,&local_d8,&local_70,&local_78,cmpReference,
                           result,isFixedPointDepth);
        fVar6 = local_a8;
        if (bVar2) {
          return true;
        }
      }
    } while ((int)c <= (int)fVar5);
  }
  return false;
}

Assistant:

static bool isLinearCompareResultValid (const ConstPixelBufferAccess&		level,
										const Sampler&						sampler,
										const TexComparePrecision&			prec,
										const Vec2&							coord,
										const int							coordZ,
										const float							cmpReference,
										const float							result)
{
	const bool	isFixedPointDepth	= isFixedPointDepthTextureFormat(level.getFormat());
	const Vec2	uBounds				= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(),	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds				= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getHeight(),	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinate bounds for (x0,y0) - without wrap mode
	const int	minI		= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int	maxI		= deFloorFloatToInt32(uBounds.y()-0.5f);
	const int	minJ		= deFloorFloatToInt32(vBounds.x()-0.5f);
	const int	maxJ		= deFloorFloatToInt32(vBounds.y()-0.5f);

	const int	w			= level.getWidth();
	const int	h			= level.getHeight();

	// \todo [2013-07-03 pyry] This could be optimized by first computing ranges based on wrap mode.

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			// Wrapped coordinates
			const int	x0		= wrap(sampler.wrapS, i  , w);
			const int	x1		= wrap(sampler.wrapS, i+1, w);
			const int	y0		= wrap(sampler.wrapT, j  , h);
			const int	y1		= wrap(sampler.wrapT, j+1, h);

			// Bounds for filtering factors
			const float	minA	= de::clamp((uBounds.x()-0.5f)-float(i), 0.0f, 1.0f);
			const float	maxA	= de::clamp((uBounds.y()-0.5f)-float(i), 0.0f, 1.0f);
			const float	minB	= de::clamp((vBounds.x()-0.5f)-float(j), 0.0f, 1.0f);
			const float	maxB	= de::clamp((vBounds.y()-0.5f)-float(j), 0.0f, 1.0f);

			const Vec4	depths	(lookupDepth(level, sampler, x0, y0, coordZ),
								 lookupDepth(level, sampler, x1, y0, coordZ),
								 lookupDepth(level, sampler, x0, y1, coordZ),
								 lookupDepth(level, sampler, x1, y1, coordZ));

			if (isBilinearCompareValid(sampler.compare, prec, depths, Vec2(minA, maxA), Vec2(minB, maxB), cmpReference, result, isFixedPointDepth))
				return true;
		}
	}

	return false;
}